

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<std::complex<double>_>::Decompose_Cholesky(TPZMatrix<std::complex<double>_> *this)

{
  char cVar1;
  int iVar2;
  int extraout_var;
  long lVar3;
  long lVar4;
  long lVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __z;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double __z_00;
  double dVar6;
  double extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double in_XMM1_Qa;
  double dVar7;
  complex<double> tmp;
  undefined1 local_98 [24];
  double local_80;
  double local_78;
  double dStack_70;
  long local_60;
  double local_58;
  double local_50;
  long local_48;
  undefined1 local_40 [16];
  
  cVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar1 != '\0') && (cVar1 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fDecomposed == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_60 = CONCAT44(extraout_var,iVar2);
    if (local_60 != 0 && -1 < extraout_var) {
      lVar3 = 0;
      do {
        if (lVar3 != 0) {
          lVar5 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar5)
            ;
            local_80 = in_XMM1_Qa;
            local_78 = extraout_XMM0_Qa;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar5)
            ;
            in_XMM1_Qa = -in_XMM1_Qa;
            local_98._0_8_ = local_78;
            local_98._8_8_ = local_80;
            local_58 = extraout_XMM0_Qa_00;
            local_50 = in_XMM1_Qa;
            std::complex<double>::operator*=
                      ((complex<double> *)local_98,(complex<double> *)&local_58);
            local_78 = (double)local_98._0_8_ + 0.0;
            dStack_70 = (double)local_98._8_8_ + 0.0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar3)
            ;
            local_98._0_8_ = extraout_XMM0_Qa_01 - local_78;
            local_98._8_8_ = in_XMM1_Qa - dStack_70;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar3,lVar3,local_98);
            lVar5 = lVar5 + 1;
          } while (lVar3 != lVar5);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar3);
        local_58 = csqrt(__z);
        local_50 = in_XMM1_Qa;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar3,lVar3,(complex<double> *)&local_58);
        lVar5 = lVar3 + 1;
        local_48 = lVar5;
        if (lVar5 < local_60) {
          do {
            if (lVar3 != 0) {
              lVar4 = 0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar3,lVar4);
                local_80 = in_XMM1_Qa;
                local_78 = extraout_XMM0_Qa_02;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar5,lVar4);
                in_XMM1_Qa = -in_XMM1_Qa;
                local_98._0_8_ = local_78;
                local_98._8_8_ = local_80;
                local_40._8_8_ = in_XMM1_Qa;
                std::complex<double>::operator*=
                          ((complex<double> *)local_98,(complex<double> *)local_40);
                local_78 = (double)local_98._0_8_ + 0.0;
                dStack_70 = (double)local_98._8_8_ + 0.0;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar3,lVar5);
                local_98._0_8_ = extraout_XMM0_Qa_03 - local_78;
                local_98._8_8_ = in_XMM1_Qa - dStack_70;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar3,lVar5,local_98);
                lVar4 = lVar4 + 1;
              } while (lVar3 != lVar4);
            }
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar3)
            ;
            dVar6 = cabs(__z_00);
            dVar7 = 1e-12;
            if (ABS(dVar6) < 1e-12) {
              Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
            }
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar5)
            ;
            local_80 = dVar7;
            local_78 = extraout_XMM0_Qa_04;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar3)
            ;
            in_XMM1_Qa = local_80;
            local_98._0_8_ = __divdc3(local_78,local_80,extraout_XMM0_Qa_05,dVar7);
            local_98._8_8_ = in_XMM1_Qa;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar3,lVar5,local_98);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar5)
            ;
            in_XMM1_Qa = -in_XMM1_Qa;
            local_98._0_8_ = extraout_XMM0_Qa_06;
            local_98._8_8_ = in_XMM1_Qa;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar5,lVar3,local_98);
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_60);
        }
        lVar3 = local_48;
      } while (local_48 != local_60);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}